

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O2

void __thiscall
ftxui::(anonymous_namespace)::
compose(std::function<std::shared_ptr<ftxui::Node>(std::shared_ptr<ftxui::Node>)>,std::function<std::shared_ptr<ftxui::Node>(std::shared_ptr<ftxui::Node>)>)
::$_0::~__0(__0 *this)

{
  std::_Function_base::~_Function_base((_Function_base *)(this + 0x20));
  std::_Function_base::~_Function_base((_Function_base *)this);
  return;
}

Assistant:

Decorator compose(Decorator a, Decorator b) {
  return [a = std::move(a), b = std::move(b)](Element element) {
    return b(a(std::move(element)));
  };
}